

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vfy.cc
# Opt level: O3

int check_crl_time(X509_STORE_CTX *ctx,X509_CRL *crl,int notify)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  int64_t iVar4;
  ASN1_TIME *pAVar5;
  int64_t ctm_time;
  long local_30;
  
  uVar1 = ctx->param->flags;
  if (((uint)uVar1 >> 0x15 & 1) == 0) {
    if (notify != 0) {
      ctx->current_crl = crl;
    }
    if ((uVar1 & 2) == 0) {
      iVar4 = time((time_t *)0x0);
    }
    else {
      iVar4 = ctx->param->check_time;
    }
    pAVar5 = X509_CRL_get0_lastUpdate(crl);
    iVar2 = ASN1_TIME_to_posix(pAVar5,&local_30);
    if (iVar2 == 0) {
      if (notify != 0) {
        ctx->error = 0xf;
LAB_0019c164:
        uVar3 = (*ctx->verify_cb)(0,ctx);
        if (1 < uVar3) goto LAB_0019c1fe;
        if (uVar3 == 0) {
          return 0;
        }
        goto LAB_0019c17c;
      }
    }
    else if (iVar4 < local_30) {
      if (notify != 0) {
        ctx->error = 0xb;
        goto LAB_0019c164;
      }
    }
    else {
LAB_0019c17c:
      pAVar5 = X509_CRL_get0_nextUpdate(crl);
      if (pAVar5 == (ASN1_TIME *)0x0) {
LAB_0019c1a9:
        if (notify == 0) goto LAB_0019c1e3;
LAB_0019c1db:
        ctx->current_crl = (X509_CRL *)0x0;
        goto LAB_0019c1e3;
      }
      pAVar5 = X509_CRL_get0_nextUpdate(crl);
      iVar2 = ASN1_TIME_to_posix(pAVar5,&local_30);
      if (iVar2 == 0) {
        if (notify != 0) {
          ctx->error = 0x10;
LAB_0019c1c7:
          uVar3 = (*ctx->verify_cb)(0,ctx);
          if (1 < uVar3) {
LAB_0019c1fe:
            abort();
          }
          if (uVar3 == 0) {
            return 0;
          }
          goto LAB_0019c1db;
        }
      }
      else {
        if (iVar4 < local_30) goto LAB_0019c1a9;
        if (notify != 0) {
          ctx->error = 0xc;
          goto LAB_0019c1c7;
        }
      }
    }
    iVar2 = 0;
  }
  else {
LAB_0019c1e3:
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int check_crl_time(X509_STORE_CTX *ctx, X509_CRL *crl, int notify) {
  if (ctx->param->flags & X509_V_FLAG_NO_CHECK_TIME) {
    return 1;
  }

  if (notify) {
    ctx->current_crl = crl;
  }
  int64_t ptime;
  if (ctx->param->flags & X509_V_FLAG_USE_CHECK_TIME) {
    ptime = ctx->param->check_time;
  } else {
    ptime = time(NULL);
  }

  int i = X509_cmp_time_posix(X509_CRL_get0_lastUpdate(crl), ptime);
  if (i == 0) {
    if (!notify) {
      return 0;
    }
    ctx->error = X509_V_ERR_ERROR_IN_CRL_LAST_UPDATE_FIELD;
    if (!call_verify_cb(0, ctx)) {
      return 0;
    }
  }

  if (i > 0) {
    if (!notify) {
      return 0;
    }
    ctx->error = X509_V_ERR_CRL_NOT_YET_VALID;
    if (!call_verify_cb(0, ctx)) {
      return 0;
    }
  }

  if (X509_CRL_get0_nextUpdate(crl)) {
    i = X509_cmp_time_posix(X509_CRL_get0_nextUpdate(crl), ptime);

    if (i == 0) {
      if (!notify) {
        return 0;
      }
      ctx->error = X509_V_ERR_ERROR_IN_CRL_NEXT_UPDATE_FIELD;
      if (!call_verify_cb(0, ctx)) {
        return 0;
      }
    }
    if (i < 0) {
      if (!notify) {
        return 0;
      }
      ctx->error = X509_V_ERR_CRL_HAS_EXPIRED;
      if (!call_verify_cb(0, ctx)) {
        return 0;
      }
    }
  }

  if (notify) {
    ctx->current_crl = NULL;
  }

  return 1;
}